

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

evdns_getaddrinfo_request *
evutil_getaddrinfo_async_
          (evdns_base *dns_base,char *nodename,char *servname,addrinfo *hints_in,
          _func_void_int_addrinfo_ptr_void_ptr *cb,void *arg)

{
  int iVar1;
  addrinfo *paStack_48;
  int err;
  addrinfo *ai;
  void *arg_local;
  _func_void_int_addrinfo_ptr_void_ptr *cb_local;
  addrinfo *hints_in_local;
  char *servname_local;
  char *nodename_local;
  evdns_base *dns_base_local;
  
  ai = (addrinfo *)arg;
  arg_local = cb;
  cb_local = (_func_void_int_addrinfo_ptr_void_ptr *)hints_in;
  hints_in_local = (addrinfo *)servname;
  servname_local = nodename;
  nodename_local = (char *)dns_base;
  if ((dns_base == (evdns_base *)0x0) || (evdns_getaddrinfo_impl == (evdns_getaddrinfo_fn)0x0)) {
    paStack_48 = (addrinfo *)0x0;
    iVar1 = evutil_getaddrinfo(nodename,servname,hints_in,&stack0xffffffffffffffb8);
    (*(code *)arg_local)(iVar1,paStack_48,ai);
    dns_base_local = (evdns_base *)0x0;
  }
  else {
    dns_base_local =
         (evdns_base *)(*evdns_getaddrinfo_impl)(dns_base,nodename,servname,hints_in,cb,arg);
  }
  return (evdns_getaddrinfo_request *)dns_base_local;
}

Assistant:

struct evdns_getaddrinfo_request *evutil_getaddrinfo_async_(
    struct evdns_base *dns_base,
    const char *nodename, const char *servname,
    const struct evutil_addrinfo *hints_in,
    void (*cb)(int, struct evutil_addrinfo *, void *), void *arg)
{
	if (dns_base && evdns_getaddrinfo_impl) {
		return evdns_getaddrinfo_impl(
			dns_base, nodename, servname, hints_in, cb, arg);
	} else {
		struct evutil_addrinfo *ai=NULL;
		int err;
		err = evutil_getaddrinfo(nodename, servname, hints_in, &ai);
		cb(err, ai, arg);
		return NULL;
	}
}